

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::NonColorDepthStencilRenderableInternalformatsAreRejectedTest::iterate
          (NonColorDepthStencilRenderableInternalformatsAreRejectedTest *this)

{
  bool bVar1;
  int iVar2;
  deBool dVar3;
  int iVar4;
  ContextInfo *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *pTVar6;
  int local_34;
  int internalformat_index;
  int number_of_internalformats_to_check;
  Functions *gl;
  NonColorDepthStencilRenderableInternalformatsAreRejectedTest *this_local;
  
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (this_00,"GL_OES_texture_storage_multisample_2d_array");
  this->gl_oes_texture_multisample_2d_array_supported = bVar1;
  if (this->gl_oes_texture_multisample_2d_array_supported == '\0') {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"OES_texture_storage_multisample_2d_array");
  }
  else {
    pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar5->_vptr_RenderContext[3])();
    initInternals(this);
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (this->to_id == 0)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Texture object has not been generated.","to_id != 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,0x1d4);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x13a8))
                (0x9102,1,*(undefined4 *)(unsupported_internalformats + (long)local_34 * 4),1,1,1,1)
      ;
      do {
        dVar3 = ::deGetFalse();
        if (dVar3 != 0) {
LAB_013f51fa:
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,"gltexStorage3DMultisample() did not generate GL_INVALID_ENUM error.",
                     "gl.getError() == GL_INVALID_ENUM",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                     ,0x1e4);
          __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        iVar4 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
        if (iVar4 != 0x500) goto LAB_013f51fa;
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult NonColorDepthStencilRenderableInternalformatsAreRejectedTest::iterate()
{
	gl_oes_texture_multisample_2d_array_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");

	if (!gl_oes_texture_multisample_2d_array_supported)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "OES_texture_storage_multisample_2d_array");

		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Check if texture object was generated properly. */
	TCU_CHECK_MSG(to_id != 0, "Texture object has not been generated.");

	const int number_of_internalformats_to_check =
		sizeof(unsupported_internalformats) / sizeof(unsupported_internalformats[0]);

	/* Go through all requested internalformats. */
	for (int internalformat_index = 0; internalformat_index < number_of_internalformats_to_check;
		 internalformat_index++)
	{
		gl.texStorage3DMultisample(
			GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 1,
			unsupported_internalformats[internalformat_index], /* One of unsupported internalformats. */
			1, 1, 1, true);

		/* Expect GL_INVALID_ENUM error code. */
		TCU_CHECK_MSG(gl.getError() == GL_INVALID_ENUM,
					  "gltexStorage3DMultisample() did not generate GL_INVALID_ENUM error.");
	} /* for each unsupported internalformat */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}